

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_logand(LispPTR tosm1,LispPTR tos)

{
  ushort uVar1;
  LispPTR *pLVar2;
  float *pfVar3;
  uint *NAddr;
  LispPTR LVar4;
  uint uVar5;
  LispPTR LVar6;
  
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    LVar6 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    LVar6 = tosm1 & 0xffff;
  }
  else {
    uVar1 = *(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar3 = (float *)NativeAligned4FromLAddr(tosm1);
      if (*pfVar3 != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      LVar6 = (LispPTR)*pfVar3;
    }
    else {
      if (uVar1 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar2 = NativeAligned4FromLAddr(tosm1);
      LVar6 = *pLVar2;
    }
  }
  if ((tos & 0xfff0000) == 0xf0000) {
    LVar4 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    LVar4 = tos & 0xffff;
  }
  else {
    uVar1 = *(ushort *)((ulong)(tos >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar3 = (float *)NativeAligned4FromLAddr(tos);
      if (*pfVar3 != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      LVar4 = (LispPTR)*pfVar3;
    }
    else {
      if (uVar1 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar2 = NativeAligned4FromLAddr(tos);
      LVar4 = *pLVar2;
    }
  }
  uVar5 = LVar4 & LVar6;
  if ((uVar5 & 0xffff0000) == 0xffff0000) {
    LVar6 = uVar5 & 0xffff | 0xf0000;
  }
  else {
    if ((uVar5 & 0xffff0000) != 0) {
      NAddr = (uint *)createcell68k(2);
      *NAddr = uVar5;
      LVar6 = LAddrFromNative(NAddr);
      return LVar6;
    }
    LVar6 = uVar5 | 0xe0000;
  }
  return LVar6;
}

Assistant:

LispPTR N_OP_logand(LispPTR tosm1, LispPTR tos) {
    int arg1, arg2;

    N_IGETNUMBER(tosm1, arg1, do_ufn);
    N_IGETNUMBER(tos, arg2, do_ufn);

    arg1 = arg1 & arg2;

    N_ARITH_SWITCH(arg1);

  do_ufn:
    ERROR_EXIT(tos);
}